

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O0

HighsDebugStatus __thiscall HEkk::debugBasisCorrect(HEkk *this,HighsLp *lp)

{
  long lVar1;
  HighsDebugStatus HVar2;
  long in_RDI;
  bool correct_nonbasicMove;
  bool consistent;
  HighsDebugStatus return_status;
  HighsOptions *options;
  HighsLp *in_stack_00000040;
  HEkk *in_stack_00000048;
  HighsDebugStatus local_24;
  HighsDebugStatus local_4;
  
  lVar1 = *(long *)(in_RDI + 8);
  if (*(int *)(lVar1 + 0x15c) < 1) {
    local_4 = kNotChecked;
  }
  else {
    local_24 = kOk;
    HVar2 = debugBasisConsistent(this);
    if (HVar2 == kLogicalError) {
      highsLogDev((HighsLogOptions *)(lVar1 + 0x380),kError,
                  "Supposed to be a Simplex basis, but not consistent\n");
      local_24 = kLogicalError;
    }
    if (*(int *)(lVar1 + 0x15c) < 2) {
      local_4 = local_24;
    }
    else {
      HVar2 = debugNonbasicMove(in_stack_00000048,in_stack_00000040);
      if (HVar2 == kLogicalError) {
        highsLogDev((HighsLogOptions *)(lVar1 + 0x380),kError,
                    "Supposed to be a Simplex basis, but nonbasicMove is incorrect\n");
        local_24 = kLogicalError;
      }
      local_4 = local_24;
    }
  }
  return local_4;
}

Assistant:

HighsDebugStatus HEkk::debugBasisCorrect(const HighsLp* lp) const {
  // Nontrivially expensive analysis of a Simplex basis, checking
  // consistency, and then correctness of nonbasicMove
  const HighsOptions& options = *(this->options_);
  if (options.highs_debug_level < kHighsDebugLevelCheap)
    return HighsDebugStatus::kNotChecked;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  const bool consistent =
      this->debugBasisConsistent() != HighsDebugStatus::kLogicalError;
  if (!consistent) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "Supposed to be a Simplex basis, but not consistent\n");
    assert(consistent);
    return_status = HighsDebugStatus::kLogicalError;
  }
  if (options.highs_debug_level < kHighsDebugLevelCostly) return return_status;
  const bool correct_nonbasicMove =
      this->debugNonbasicMove(lp) != HighsDebugStatus::kLogicalError;
  if (!correct_nonbasicMove) {
    highsLogDev(
        options.log_options, HighsLogType::kError,
        "Supposed to be a Simplex basis, but nonbasicMove is incorrect\n");
    assert(correct_nonbasicMove);
    return_status = HighsDebugStatus::kLogicalError;
  }
  return return_status;
}